

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_statistics.cpp
# Opt level: O2

void __thiscall
duckdb::TableStatistics::InitializeEmpty
          (TableStatistics *this,vector<duckdb::LogicalType,_true> *types)

{
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> _Var1;
  pointer pLVar2;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> _Var3;
  pointer type;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  make_shared_ptr<std::mutex>();
  shared_ptr<std::mutex,_true>::operator=
            (&this->stats_lock,(shared_ptr<std::mutex,_true> *)&stack0xffffffffffffffc0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
  make_uniq<duckdb::ReservoirSample,unsigned_long>
            ((duckdb *)&stack0xffffffffffffffc0,(unsigned_long *)&stack0xffffffffffffffd0);
  _Var3._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (BlockingSample *)0x0;
  _Var1._M_head_impl =
       (this->table_sample).
       super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
       super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
       .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl;
  (this->table_sample).
  super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>.
  super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var1._M_head_impl != (BlockingSample *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_BlockingSample + 8))();
    if (local_40._M_head_impl != (BlockingSample *)0x0) {
      (**(code **)((((element_type *)local_40._M_head_impl)->super___mutex_base)._M_mutex.__align +
                  8))();
    }
  }
  pLVar2 = (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (type = (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start; type != pLVar2; type = type + 1) {
    ColumnStatistics::CreateEmptyStats((ColumnStatistics *)&stack0xffffffffffffffc0,type);
    ::std::
    vector<duckdb::shared_ptr<duckdb::ColumnStatistics,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,true>>>
    ::emplace_back<duckdb::shared_ptr<duckdb::ColumnStatistics,true>>
              ((vector<duckdb::shared_ptr<duckdb::ColumnStatistics,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,true>>>
                *)&this->column_stats,
               (shared_ptr<duckdb::ColumnStatistics,_true> *)&stack0xffffffffffffffc0);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  }
  return;
}

Assistant:

void TableStatistics::InitializeEmpty(const vector<LogicalType> &types) {
	D_ASSERT(Empty());
	D_ASSERT(!table_sample);

	stats_lock = make_shared_ptr<mutex>();
	table_sample = make_uniq<ReservoirSample>(static_cast<idx_t>(FIXED_SAMPLE_SIZE));
	for (auto &type : types) {
		column_stats.push_back(ColumnStatistics::CreateEmptyStats(type));
	}
}